

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void FlushSnapshotToDisk(CCoinsViewCache *coins_cache,bool snapshot_loaded)

{
  long lVar1;
  char *fmt;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this;
  char **args;
  byte in_SIL;
  unsigned_long *in_RDI;
  long in_FS_OFFSET;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  CCoinsViewCache *this_00;
  allocator<char> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CCoinsViewCache *)&stack0xffffffffffffff57;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  fmt = "flushing coins cache";
  if ((in_SIL & 1) != 0) {
    fmt = "saving snapshot chainstate";
  }
  this = (Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
         CCoinsViewCache::DynamicMemoryUsage(this_00);
  args = (char **)((ulong)this / 1000000);
  tinyformat::format<char_const*,unsigned_long>(fmt,args,in_RDI);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (LogFlags)fmt,SUB81((ulong)args >> 0x38,0));
  std::__cxx11::string::~string(in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(in_stack_ffffffffffffff08);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  CCoinsViewCache::Flush(this_00);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void FlushSnapshotToDisk(CCoinsViewCache& coins_cache, bool snapshot_loaded)
{
    LOG_TIME_MILLIS_WITH_CATEGORY_MSG_ONCE(
        strprintf("%s (%.2f MB)",
                  snapshot_loaded ? "saving snapshot chainstate" : "flushing coins cache",
                  coins_cache.DynamicMemoryUsage() / (1000 * 1000)),
        BCLog::LogFlags::ALL);

    coins_cache.Flush();
}